

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *this,SolveAlgorithm *x)

{
  bool bVar1;
  SolveAlgorithm *pSVar2;
  _func_int **pp_Var3;
  SolveAlgorithm *in_RSI;
  SolveAlgorithm *in_RDI;
  DeleteObject deleter;
  
  pSVar2 = get((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x12f1d6);
  if ((in_RSI != pSVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x12f1ec),
     bVar1)) {
    release((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  pp_Var3 = (_func_int **)
            set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  in_RDI->_vptr_SolveAlgorithm = pp_Var3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}